

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointTest.cpp
# Opt level: O3

void __thiscall PointDiffRetractation::test_method(PointDiffRetractation *this)

{
  bool bVar1;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *pCVar2;
  long lVar3;
  MatrixXd Jtest;
  SO3<mnf::ExpMapMatrix> S;
  Point x;
  Matrix<double,__1,__1,_0,__1,__1> local_368;
  Matrix<double,__1,__1,_0,__1,__1> local_348;
  Scalar local_330;
  char *local_328;
  char *local_320;
  undefined **local_318;
  ulong local_310;
  undefined8 *puStack_308;
  char **local_300;
  undefined8 uStack_2f8;
  Scalar local_2f0 [2];
  shared_count sStack_2e0;
  undefined *local_2d8;
  undefined8 uStack_2d0;
  undefined8 local_2c8;
  Scalar local_2b8;
  Scalar local_2b0;
  Scalar local_2a8;
  Scalar local_2a0;
  Scalar local_298;
  Scalar local_290;
  Scalar local_288;
  Scalar local_280;
  Scalar local_278;
  Scalar local_270;
  Scalar local_268;
  Scalar local_260;
  Scalar local_258;
  Scalar local_250;
  Scalar local_248;
  Scalar local_240;
  Scalar local_238;
  Scalar local_230;
  Scalar local_228;
  Scalar local_220;
  Scalar local_218;
  char *local_210;
  char *local_208;
  undefined1 *local_200;
  undefined1 *local_1f8;
  char *local_1f0;
  char *local_1e8;
  SO3<mnf::ExpMapMatrix> local_1e0;
  undefined1 local_140 [24];
  long local_128;
  
  mnf::SO3<mnf::ExpMapMatrix>::SO3(&local_1e0);
  local_348.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols = 0;
  local_348.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)0x0;
  local_348.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows = 0;
  local_368.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols = 0;
  local_368.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)0x0;
  local_368.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows = 0;
  local_368.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       Eigen::internal::conditional_aligned_new_auto<double,true>(0x1b);
  local_140._0_8_ = &local_368;
  local_368.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows = 9;
  local_368.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols = 3;
  local_140._8_8_ = (void *)0x0;
  local_140._16_8_ = 1;
  local_128 = 1;
  *local_368.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data = 0.0
  ;
  local_318 = (undefined **)0x3f6d54e8433e0918;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     ((CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_140,
                      (Scalar *)&local_318);
  local_2d8 = (undefined *)0xbfe1dd4409c395db;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar2,(Scalar *)&local_2d8);
  local_2f0[0] = 0.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar2,local_2f0);
  local_328 = (char *)0x3fe4ac985e75dd74;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar2,(Scalar *)&local_328);
  local_330 = 0.634553549147103;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar2,&local_330);
  local_218 = 0.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar2,&local_218);
  local_220 = -0.763270824459509;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar2,&local_220);
  local_228 = 0.534497507539106;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar2,&local_228);
  local_230 = -0.003580526006716;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar2,&local_230);
  local_238 = 0.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar2,&local_238);
  local_240 = -0.829658346630838;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar2,&local_240);
  local_248 = -0.646068748944272;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar2,&local_248);
  local_250 = 0.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar2,&local_250);
  local_258 = -0.424189774632061;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar2,&local_258);
  local_260 = 0.763270824459509;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar2,&local_260);
  local_268 = 0.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar2,&local_268);
  local_270 = -0.362946363755562;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar2,&local_270);
  local_278 = 0.558259982176135;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar2,&local_278);
  local_280 = 0.829658346630838;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar2,&local_280);
  local_288 = 0.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar2,&local_288);
  local_290 = -0.634553549147103;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar2,&local_290);
  local_298 = 0.424189774632061;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar2,&local_298);
  local_2a0 = 0.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar2,&local_2a0);
  local_2a8 = -0.534497507539106;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar2,&local_2a8);
  local_2b0 = 0.362946363755562;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar2,&local_2b0);
  local_2b8 = 0.0;
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_(pCVar2,&local_2b8);
  lVar3 = (((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_140._0_8_)->
          m_storage).m_cols;
  if (local_128 + local_140._8_8_ !=
      (((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_140._0_8_)->m_storage).
      m_rows) {
    if (lVar3 != 0) goto LAB_001145f9;
    lVar3 = 0;
  }
  if (local_140._16_8_ == lVar3) {
    local_2d8 = (undefined *)0x3fe5c5a1cac08312;
    uStack_2d0 = 0xbfcb09b738e6d15b;
    local_2c8 = 0x3fe21e4b44a1f080;
    mnf::Manifold::getZero();
    local_300 = (char **)0x0;
    uStack_2f8 = 0;
    local_310 = 3;
    local_318 = &local_2d8;
    mnf::Point::retractation((Point *)local_140,(Ref *)local_140);
    free(local_300);
    mnf::Point::diffRetractation();
    local_348.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
         (double *)local_318;
    local_348.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
         local_310;
    local_1f0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/PointTest.cpp"
    ;
    local_1e8 = "";
    local_200 = &boost::unit_test::basic_cstring<char_const>::null;
    local_1f8 = &boost::unit_test::basic_cstring<char_const>::null;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1f0,0xd8);
    local_330 = 1e-12;
    bVar1 = Eigen::internal::
            isApprox_selector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_false>
            ::run(&local_348,&local_368,&local_330);
    local_2f0[0] = (Scalar)CONCAT71(local_2f0[0]._1_7_,bVar1);
    local_2f0[1] = 0.0;
    sStack_2e0.pi_ = (sp_counted_base *)0x0;
    local_328 = "J.isApprox(Jtest)";
    local_320 = "";
    local_310 = local_310 & 0xffffffffffffff00;
    local_318 = &PTR__lazy_ostream_00128c30;
    puStack_308 = &boost::unit_test::lazy_ostream::inst;
    local_210 = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/PointTest.cpp"
    ;
    local_208 = "";
    local_300 = &local_328;
    boost::test_tools::tt_detail::report_assertion();
    boost::detail::shared_count::~shared_count(&sStack_2e0);
    mnf::ConstSubPoint::~ConstSubPoint((ConstSubPoint *)&local_128);
    free((void *)local_140._8_8_);
    free(local_368.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
        );
    free(local_348.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
        );
    local_1e0._0_8_ = &PTR__SO3_00128a20;
    mnf::ReusableTemporaryMap::~ReusableTemporaryMap
              ((ReusableTemporaryMap *)((long)&local_1e0 + 0x58));
    mnf::Manifold::~Manifold(&local_1e0.super_Manifold);
    return;
  }
LAB_001145f9:
  __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                ,"/usr/include/eigen3/Eigen/src/Core/CommaInitializer.h",0x7c,
                "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, -1, -1>>::finished() [MatrixType = Eigen::Matrix<double, -1, -1>]"
               );
}

Assistant:

BOOST_AUTO_TEST_CASE(PointDiffRetractation)
{
  SO3<ExpMapMatrix> S;
  Eigen::MatrixXd J;
  Eigen::MatrixXd Jtest(9, 3);
  Jtest << 0, 0.003580526006716, -0.558259982176135, 0, 0.646068748944272,
      0.634553549147103, 0, -0.763270824459509, 0.534497507539106,
      -0.003580526006716, 0, -0.829658346630838, -0.646068748944272, 0,
      -0.424189774632061, 0.763270824459509, 0, -0.362946363755562,
      0.558259982176135, 0.829658346630838, 0, -0.634553549147103,
      0.424189774632061, 0, -0.534497507539106, 0.362946363755562, 0;
  Eigen::Vector3d v(0.680375, -0.211234, 0.566198);
  Point x = S.getZero();
  x.retractation(x, v);
  J = x.diffRetractation();
  BOOST_CHECK(J.isApprox(Jtest));
}